

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_starts_with(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  vm_datatype_t vVar2;
  ushort *puVar3;
  
  if (getp_starts_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_starts_with();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_starts_with::desc);
  if (iVar1 == 0) {
    puVar3 = (ushort *)CVmBif::pop_str_val();
    if ((*(ushort *)str < *puVar3) || (iVar1 = bcmp(str + 2,puVar3 + 1,(ulong)*puVar3), iVar1 != 0))
    {
      vVar2 = VM_NIL;
    }
    else {
      vVar2 = VM_TRUE;
    }
    retval->typ = vVar2;
    return 1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_starts_with(VMG_ vm_val_t *retval,
                                   const vm_val_t *self_val,
                                   const char *str, uint *argc)
{
    const char *str2;
    size_t len;
    size_t len2;

    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the other string */
    str2 = CVmBif::pop_str_val(vmg0_);

    /* get the lengths of the two strings */
    len = vmb_get_len(str);
    len2 = vmb_get_len(str2);

    /* move to the contents of each string */
    str += VMB_LEN;
    str2 += VMB_LEN;

    /* 
     *   if the other string is no longer than our string, and the other
     *   string matches our string exactly for the other string's entire
     *   length, we start with the other string 
     */
    retval->set_logical(len2 <= len && memcmp(str, str2, len2) == 0);

    /* handled */
    return TRUE;
}